

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::returnStmt(Parse *this)

{
  KeyWordTable *pKVar1;
  DelimiterTable *pDVar2;
  int iVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  bool bVar9;
  allocator local_79;
  key_type local_78;
  Type local_58;
  Type local_54;
  Type returnType_1;
  Type returnType;
  byte local_3a;
  allocator local_39;
  key_type local_38;
  Parse *local_18;
  Parse *this_local;
  
  local_18 = this;
  pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                     (this->tokenVec,(long)this->curIndex);
  local_3a = 0;
  returnType_1._3_1_ = 0;
  bVar9 = false;
  if (pvVar4->type == KEYWORD) {
    pKVar1 = this->keyWordTable;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"return",&local_39);
    returnType_1._3_1_ = 1;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pKVar1->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_38);
    iVar3 = *pmVar5;
    pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar9 = iVar3 == pvVar4->id;
  }
  if ((returnType_1._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (bVar9) {
    this->curIndex = this->curIndex + 1;
    iVar3 = expression(this);
    if (iVar3 == 0) {
      pvVar6 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar6,0);
      local_54 = pvVar7->type;
      if (local_54 != VOID) {
        poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21ab0);
        pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar4->line);
        poVar8 = std::operator<<(poVar8,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[7],char_const(&)[3],char_const(&)[3],char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return"
                 ,(char (*) [3])"__",(char (*) [3])"__",(char (*) [3])"__");
    }
    else {
      pvVar6 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar6,0);
      local_58 = pvVar7->type;
      if (local_58 == VOID) {
        poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21abc);
        pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar4->line);
        poVar8 = std::operator<<(poVar8,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return"
                 ,&this->expName,(char (*) [3])"__",(char (*) [3])"__");
    }
    pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar9 = false;
    if (pvVar4->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,anon_var_dwarf_21880 + 0x12,&local_79);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_78);
      iVar3 = *pmVar5;
      pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar9 = iVar3 == pvVar4->id;
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    if (!bVar9) {
      pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      std::operator<<((ostream *)&std::cout,(string *)&pvVar4->name);
      poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21ad4);
      pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar4->line + -1);
      poVar8 = std::operator<<(poVar8,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curIndex = this->curIndex + 1;
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::returnStmt() {
    if(tokenVec[curIndex].type == KEYWORD && keyWordTable.index["return"] == tokenVec[curIndex].id) {
        curIndex++;
        if(!expression()) {
            Type returnType = st.symbolTable[curFun][0].type;
            //cout << returnType << endl;
            if(returnType != Type::VOID) {
                cout << "函数类型需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            quadVec.emplace_back("return", "__", "__", "__");
        } else {
            Type returnType = st.symbolTable[curFun][0].type;
//            cout << returnType << endl;
            if(returnType == Type::VOID) {
                cout << "函数类型是void 不需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            //return语句四元式设计
            quadVec.emplace_back("return", expName, "__", "__");
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << tokenVec[curIndex].name;
            cout<<"return 语句缺少';'在第" << tokenVec[curIndex].line -1 << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}